

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O1

FT_Error tt_face_palette_set(TT_Face face,FT_UInt palette_index)

{
  FT_Byte *pFVar1;
  ushort uVar2;
  void *pvVar3;
  FT_Color *pFVar4;
  ushort uVar5;
  FT_Error FVar6;
  long lVar7;
  long lVar8;
  
  pvVar3 = face->cpal;
  FVar6 = 6;
  if ((pvVar3 != (void *)0x0) && (palette_index < (face->palette_data).num_palettes)) {
    uVar2 = *(ushort *)(*(long *)((long)pvVar3 + 0x10) + (ulong)palette_index * 2);
    uVar5 = uVar2 << 8 | uVar2 >> 8;
    uVar2 = (face->palette_data).num_palette_entries;
    FVar6 = 8;
    if ((uint)uVar5 + (uint)uVar2 <= (uint)*(ushort *)((long)pvVar3 + 2)) {
      if ((ulong)uVar2 == 0) {
        return 0;
      }
      pFVar4 = face->palette;
      lVar7 = (ulong)uVar5 * 4 + *(long *)((long)pvVar3 + 8);
      FVar6 = 0;
      lVar8 = 0;
      do {
        pFVar1 = &pFVar4->blue + lVar8;
        *pFVar1 = *(FT_Byte *)(lVar7 + lVar8);
        pFVar1[1] = *(FT_Byte *)(lVar7 + 1 + lVar8);
        pFVar1[2] = *(FT_Byte *)(lVar7 + 2 + lVar8);
        pFVar1[3] = *(FT_Byte *)(lVar7 + 3 + lVar8);
        lVar8 = lVar8 + 4;
      } while ((FT_Color *)(pFVar1 + 4) < pFVar4 + uVar2);
    }
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_palette_set( TT_Face  face,
                       FT_UInt  palette_index )
  {
    Cpal*  cpal = (Cpal*)face->cpal;

    FT_Byte*   offset;
    FT_Byte*   p;

    FT_Color*  q;
    FT_Color*  limit;

    FT_UShort  color_index;


    if ( !cpal || palette_index >= face->palette_data.num_palettes )
      return FT_THROW( Invalid_Argument );

    offset      = cpal->color_indices + 2 * palette_index;
    color_index = FT_PEEK_USHORT( offset );

    if ( color_index + face->palette_data.num_palette_entries >
           cpal->num_colors )
      return FT_THROW( Invalid_Table );

    p     = cpal->colors + COLOR_SIZE * color_index;
    q     = face->palette;
    limit = q + face->palette_data.num_palette_entries;

    while ( q < limit )
    {
      q->blue  = FT_NEXT_BYTE( p );
      q->green = FT_NEXT_BYTE( p );
      q->red   = FT_NEXT_BYTE( p );
      q->alpha = FT_NEXT_BYTE( p );

      q++;
    }

    return FT_Err_Ok;
  }